

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O3

pair<QRBTree<int>::Node_*,_QRBTree<int>::Node_*> __thiscall
QTriangulator<unsigned_short>::ComplexToSimple::bounds(ComplexToSimple *this,QPodPoint *point)

{
  int iVar1;
  Edge *pEVar2;
  QPodPoint *pQVar3;
  Node *pNVar4;
  Node *pNVar5;
  long lVar6;
  long lVar7;
  Node *pNVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  pair<QRBTree<int>::Node_*,_QRBTree<int>::Node_*> pVar12;
  
  pNVar5 = (this->m_edgeList).root;
  if (pNVar5 == (Node *)0x0) {
    return (pair<QRBTree<int>::Node_*,_QRBTree<int>::Node_*>)ZEXT816(0);
  }
  pEVar2 = (this->m_edges).buffer;
  pQVar3 = (this->m_parent->m_vertices).buffer;
  lVar7 = (long)point->x;
  lVar6 = (long)point->y;
  pNVar4 = (Node *)0x0;
  do {
    iVar1 = pNVar5->data;
    lVar10 = (lVar7 - pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].x) *
             ((long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp]].y -
             (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].y);
    lVar9 = (lVar6 - pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].y) *
            ((long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp]].x -
            (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].x);
    if (lVar9 - lVar10 == 0) {
      pNVar4 = pNVar5;
      for (pNVar8 = pNVar5->left; pNVar8 != (Node *)0x0; pNVar8 = (&pNVar8->left)[bVar11]) {
        iVar1 = pNVar8->data;
        bVar11 = (lVar6 - pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].y) *
                 ((long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp]].x -
                 (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].x) -
                 (lVar7 - pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].x) *
                 ((long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp]].y -
                 (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].y) != 0;
        if (!bVar11) {
          pNVar4 = pNVar8;
        }
      }
      for (pNVar8 = pNVar5->right; pNVar8 != (Node *)0x0; pNVar8 = (&pNVar8->left)[bVar11]) {
        iVar1 = pNVar8->data;
        bVar11 = (lVar6 - pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].y) *
                 ((long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp]].x -
                 (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].x) -
                 (lVar7 - pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].x) *
                 ((long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp]].y -
                 (long)pQVar3[(&pEVar2[iVar1].from)[pEVar2[iVar1].pointingUp ^ 1]].y) == 0;
        if (bVar11) {
          pNVar5 = pNVar8;
        }
      }
      goto LAB_0044737c;
    }
    pNVar5 = (&pNVar5->left)[lVar10 <= lVar9];
  } while (pNVar5 != (Node *)0x0);
  pNVar5 = (Node *)0x0;
LAB_0044737c:
  pVar12.second = pNVar5;
  pVar12.first = pNVar4;
  return pVar12;
}

Assistant:

std::pair<QRBTree<int>::Node *, QRBTree<int>::Node *> QTriangulator<T>::ComplexToSimple::bounds(const QPodPoint &point) const
{
    QRBTree<int>::Node *current = m_edgeList.root;
    std::pair<QRBTree<int>::Node *, QRBTree<int>::Node *> result(nullptr, nullptr);
    while (current) {
        const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(current->data).lower());
        const QPodPoint &v2 = m_parent->m_vertices.at(m_edges.at(current->data).upper());
        qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(point, v1, v2);
        if (d == 0) {
            result.first = result.second = current;
            break;
        }
        current = (d < 0 ? current->left : current->right);
    }
    if (current == nullptr)
        return result;

    current = result.first->left;
    while (current) {
        const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(current->data).lower());
        const QPodPoint &v2 = m_parent->m_vertices.at(m_edges.at(current->data).upper());
        qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(point, v1, v2);
        Q_ASSERT(d >= 0);
        if (d == 0) {
            result.first = current;
            current = current->left;
        } else {
            current = current->right;
        }
    }

    current = result.second->right;
    while (current) {
        const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(current->data).lower());
        const QPodPoint &v2 = m_parent->m_vertices.at(m_edges.at(current->data).upper());
        qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(point, v1, v2);
        Q_ASSERT(d <= 0);
        if (d == 0) {
            result.second = current;
            current = current->right;
        } else {
            current = current->left;
        }
    }

    return result;
}